

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK4.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::RK4::oneStepIntegration
          (RK4 *this,double t0,double dT,VectorDynSize *x0,VectorDynSize *x)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  element_type *peVar5;
  size_t sVar6;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *other;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *this_00;
  StorageBaseType *matrix;
  double *scalar;
  Scalar *pSVar7;
  ulong in_RDX;
  long in_RDI;
  SparseMatrixBase<Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_>_>
  *in_XMM0_Qa;
  double in_XMM1_Qa;
  int i;
  bool ok;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> buffer_map;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x0_map;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x_map;
  Stride<0,_0> *in_stack_fffffffffffffcf8;
  Stride<0,_0> *in_stack_fffffffffffffd00;
  SparseMatrixBase<Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_>_>
  *in_stack_fffffffffffffd08;
  element_type *in_stack_fffffffffffffd10;
  int local_90;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (!bVar1) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x382789);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"oneStepIntegration","Dynamical system not set.");
  }
  sVar4 = iDynTree::VectorDynSize::size();
  peVar5 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3827c7);
  sVar6 = DynamicalSystem::stateSpaceSize(peVar5);
  if (sVar4 != sVar6) {
    peVar5 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3827f7);
    DynamicalSystem::stateSpaceSize(peVar5);
    iDynTree::VectorDynSize::resize(in_RDX);
  }
  other = (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
           *)iDynTree::VectorDynSize::data();
  this_00 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)iDynTree::VectorDynSize::size();
  Eigen::Stride<0,_0>::Stride(in_stack_fffffffffffffd00);
  Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffd10,(PointerArgType)in_stack_fffffffffffffd08,
             (Index)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  Eigen::Stride<0,_0>::Stride(in_stack_fffffffffffffd00);
  Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffd10,(PointerArgType)in_stack_fffffffffffffd08,
             (Index)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  matrix = (StorageBaseType *)iDynTree::VectorDynSize::data();
  scalar = (double *)iDynTree::VectorDynSize::size();
  Eigen::Stride<0,_0>::Stride(in_stack_fffffffffffffd00);
  Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffd10,(PointerArgType)in_stack_fffffffffffffd08,
             (Index)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  local_90 = 0;
  while( true ) {
    if (3 < local_90) {
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffcf8);
      Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_fffffffffffffd00,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)in_stack_fffffffffffffcf8);
      Eigen::operator*(scalar,matrix);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>::
      operator+(this_00,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                         *)other);
      Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_fffffffffffffd00,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                  *)in_stack_fffffffffffffcf8);
      return true;
    }
    in_stack_fffffffffffffd00 = (Stride<0,_0> *)(in_RDI + 0xc0);
    Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>::row
              ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)in_stack_fffffffffffffd10,
               (Index)in_stack_fffffffffffffd08);
    Eigen::SparseMatrixBase<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,_-1,_false>_>::
    transpose((SparseMatrixBase<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_> *)
              in_stack_fffffffffffffd00);
    Eigen::operator*((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffffd00,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_>,_0>_>
                *)in_stack_fffffffffffffcf8);
    Eigen::operator*(scalar,matrix);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffffd00,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)in_stack_fffffffffffffcf8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>::
    operator+(this_00,other);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffffd00,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd10 =
         std::
         __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x3829ff);
    in_stack_fffffffffffffd08 = in_XMM0_Qa;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffd00,(Index)in_stack_fffffffffffffcf8);
    uVar2 = (*in_stack_fffffffffffffd10->_vptr_DynamicalSystem[2])
                      (*pSVar7 * in_XMM1_Qa + (double)in_stack_fffffffffffffd08,
                       in_stack_fffffffffffffd10,in_RDX,in_RDI + 0xd8);
    if ((uVar2 & 1) == 0) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd10,
               (Index)in_stack_fffffffffffffd08);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffd00,
               (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffcf8);
    local_90 = local_90 + 1;
  }
  return false;
}

Assistant:

bool RK4::oneStepIntegration(double t0, double dT, const VectorDynSize &x0, VectorDynSize &x){
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Dynamical system not set.");
                }

                if (x.size() != m_dynamicalSystem_ptr->stateSpaceSize()) {
                    x.resize(m_dynamicalSystem_ptr->stateSpaceSize());
                }

                Eigen::Map<Eigen::VectorXd> x_map(x.data(), x.size());
                const Eigen::Map<const Eigen::VectorXd> x0_map(x0.data(), x0.size());
                Eigen::Map<Eigen::VectorXd> buffer_map(m_computationBuffer.data(), m_computationBuffer.size());
                bool ok;
                for (int i=0; i<4; ++i){
                    buffer_map = m_K * m_aCoefficents.row(i).transpose(); //use the x vector as buffer
                    buffer_map = dT*buffer_map;   //use the x vector as buffer
                    x_map = x0_map + buffer_map;
                    ok = m_dynamicalSystem_ptr->dynamics(x, t0 + m_cCoefficients(i)*dT, m_computationBuffer);
                    if(!ok){
                        return false;
                    }
                    m_K.col(i) = buffer_map;
                }

                buffer_map = m_K * m_bCoefficients;
                x_map = x0_map + dT * buffer_map;
                return true;
            }